

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::Scene(Scene *this,int tx,int ty)

{
  int iVar1;
  StateScene *this_00;
  GroundScene *this_01;
  
  this->x = tx;
  this->y = ty;
  this->w = 0x4b;
  this->h = 0x2e;
  this->state = 0;
  this->level = 1;
  this->levelCount = 0;
  this_00 = (StateScene *)operator_new(0x68);
  StateScene::StateScene(this_00,tx,ty);
  this->ss = this_00;
  this_01 = (GroundScene *)operator_new(0x450);
  GroundScene::GroundScene(this_01,this->x,this->y + 9);
  this->gs = this_01;
  iVar1 = this->level;
  this->ss->level = iVar1;
  this_01->level = iVar1;
  return;
}

Assistant:

Scene::Scene(int tx, int ty){
	x = tx; y = ty; w = SW; h = SH;
	state = STATE_NORMAL;
	level = 1;
	levelCount = 0;
	ss = new StateScene(x, y);
	gs = new GroundScene(x, y+SSH);
	ss->setLevel(level);
	gs->setLevel(level);
}